

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

VisitReturn __thiscall QMakeEvaluator::testFunc_cache(QMakeEvaluator *this,ProStringList *args)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1String other;
  QLatin1String other_00;
  QLatin1String other_01;
  QLatin1String other_02;
  QLatin1String other_03;
  QLatin1String other_04;
  QLatin1String other_05;
  QLatin1String other_06;
  bool bVar1;
  compare_eq_result_container<QList<ProString>,_ProString> cVar2;
  bool bVar3;
  qsizetype qVar4;
  QMakeEvaluator *ctx;
  ProValueMap *pPVar5;
  QList<ProString> *this_00;
  QMakeBaseEnv *pQVar6;
  QMakeEvaluator *this_01;
  char *pcVar7;
  QString *this_02;
  QByteArrayView *this_03;
  QList<ProString> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QStringView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  ProString *vval;
  ProStringList *__range4;
  ProStringList *oldval;
  QMakeEvaluator *baseEval;
  QMakeBaseEnv *baseEnv;
  bool hostBuild;
  bool changed;
  ProStringList *diffval;
  ProString *opt;
  ProStringList *__range2;
  anon_enum_32 mode;
  anon_enum_32 target;
  bool persist;
  VfsFlags flags;
  QString fn;
  const_iterator __end4;
  const_iterator __begin4;
  ProStringList newval;
  Iterator srcvarIt;
  ProKey dstvar;
  QString varstr;
  const_iterator __end2;
  const_iterator __begin2;
  ProStringList opts;
  ProKey srcvar;
  undefined4 in_stack_fffffffffffff7c8;
  VfsFlag in_stack_fffffffffffff7cc;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  QMakeVfs *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  QStringView *in_stack_fffffffffffff7e8;
  ProKey *in_stack_fffffffffffff7f0;
  QMakeEvaluator *in_stack_fffffffffffff7f8;
  ProString *in_stack_fffffffffffff800;
  QMakeEvaluator *in_stack_fffffffffffff808;
  qsizetype in_stack_fffffffffffff810;
  QString *in_stack_fffffffffffff818;
  QString *in_stack_fffffffffffff820;
  QMakeEvaluator *in_stack_fffffffffffff828;
  QChar fillChar;
  QMakeEvaluator *in_stack_fffffffffffff830;
  QMakeEvaluator *in_stack_fffffffffffff858;
  QMakeEvaluator *in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff8a0;
  undefined6 in_stack_fffffffffffff8a8;
  undefined1 in_stack_fffffffffffff8ae;
  byte bVar13;
  undefined1 in_stack_fffffffffffff8af;
  byte bVar14;
  QFlagsStorage<QMakeVfs::VfsFlag> in_stack_fffffffffffff8b8;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> in_stack_fffffffffffff8bc;
  int iVar15;
  int local_71c;
  int local_718;
  VisitReturn local_6fc;
  qsizetype local_6e0;
  storage_type_conflict *local_6d8;
  qsizetype local_6c8;
  storage_type_conflict *local_6c0;
  storage_type *local_690;
  undefined1 local_680 [120];
  QString local_608 [2];
  undefined4 local_5d4;
  undefined1 local_590 [120];
  QString local_518 [4];
  undefined1 local_4a8 [120];
  QString local_430 [4];
  undefined1 local_3c0 [28];
  undefined4 local_3a4;
  QString local_3a0;
  QLatin1Char local_383 [43];
  ProString *local_358;
  const_iterator local_350;
  const_iterator local_348 [4];
  QLatin1Char local_323 [179];
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  QChar local_252;
  qsizetype local_250;
  storage_type_conflict *local_248;
  storage_type *local_240;
  undefined1 local_230 [48];
  undefined8 local_200;
  ProString local_1f8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  storage_type *local_1b0;
  undefined1 local_1a0 [30];
  QChar local_182;
  qsizetype local_180;
  storage_type_conflict *local_178;
  storage_type *local_170;
  undefined1 local_160 [144];
  ProString *local_d0;
  const_iterator local_c8;
  const_iterator local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  ProString local_a0;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  local_718 = 1;
  local_71c = 0;
  memset(&local_a0,0xaa,0x30);
  ProString::ProString((ProString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  qVar4 = QList<ProString>::size(in_RSI);
  ctx = in_stack_fffffffffffff828;
  if (1 < qVar4) {
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    uStack_b0 = 0xaaaaaaaaaaaaaaaa;
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    QList<ProString>::at
              ((QList<ProString> *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
               (QString *)in_stack_fffffffffffff7d8);
    QStringView::mid(in_stack_fffffffffffff7e8,(qsizetype)in_stack_fffffffffffff7f8,
                     (qsizetype)in_stack_fffffffffffff7f0);
    QVar8.m_data._0_6_ = in_stack_fffffffffffff8a8;
    QVar8.m_size = in_stack_fffffffffffff8a0;
    QVar8.m_data._6_1_ = in_stack_fffffffffffff8ae;
    QVar8.m_data._7_1_ = in_stack_fffffffffffff8af;
    split_value_list(in_stack_fffffffffffff808,QVar8,(int)((ulong)in_stack_fffffffffffff800 >> 0x20)
                    );
    local_c0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_c0 = QList<ProString>::begin
                         ((QList<ProString> *)
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    local_c8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_c8 = QList<ProString>::end
                         ((QList<ProString> *)
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    while( true ) {
      local_d0 = local_c8.i;
      bVar1 = QList<ProString>::const_iterator::operator!=(&local_c0,local_c8);
      if (!bVar1) break;
      ctx = (QMakeEvaluator *)QList<ProString>::const_iterator::operator*(&local_c0);
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (char *)in_stack_fffffffffffff7d8);
      other.m_data = (char *)in_stack_fffffffffffff818;
      other.m_size = in_stack_fffffffffffff810;
      bVar1 = ProString::operator==
                        ((ProString *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                         other);
      if (bVar1) {
        bVar3 = false;
      }
      else {
        in_stack_fffffffffffff858 = ctx;
        QLatin1String::QLatin1String
                  ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   (char *)in_stack_fffffffffffff7d8);
        other_00.m_data = (char *)in_stack_fffffffffffff818;
        other_00.m_size = in_stack_fffffffffffff810;
        bVar1 = ProString::operator==
                          ((ProString *)
                           CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),other_00);
        if (bVar1) {
          local_718 = 2;
        }
        else {
          QLatin1String::QLatin1String
                    ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                     (char *)in_stack_fffffffffffff7d8);
          other_01.m_data = (char *)in_stack_fffffffffffff818;
          other_01.m_size = in_stack_fffffffffffff810;
          bVar1 = ProString::operator==
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),other_01)
          ;
          if (bVar1) {
            local_718 = 0;
          }
          else {
            QLatin1String::QLatin1String
                      ((QLatin1String *)
                       CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                       (char *)in_stack_fffffffffffff7d8);
            other_02.m_data = (char *)in_stack_fffffffffffff818;
            other_02.m_size = in_stack_fffffffffffff810;
            bVar1 = ProString::operator==
                              ((ProString *)
                               CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                               other_02);
            if (bVar1) {
              local_71c = 0;
            }
            else {
              QLatin1String::QLatin1String
                        ((QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                         (char *)in_stack_fffffffffffff7d8);
              other_03.m_data = (char *)in_stack_fffffffffffff818;
              other_03.m_size = in_stack_fffffffffffff810;
              bVar1 = ProString::operator==
                                ((ProString *)
                                 CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                 other_03);
              if (bVar1) {
                local_71c = 1;
              }
              else {
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                           (char *)in_stack_fffffffffffff7d8);
                other_04.m_data = (char *)in_stack_fffffffffffff818;
                other_04.m_size = in_stack_fffffffffffff810;
                bVar1 = ProString::operator==
                                  ((ProString *)
                                   CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                   other_04);
                if (!bVar1) {
                  QByteArrayView::QByteArrayView<26ul>
                            ((QByteArrayView *)
                             CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                             (char (*) [26])in_stack_fffffffffffff7d8);
                  QVar9.m_data = local_170;
                  QVar9.m_size = (qsizetype)local_160;
                  QString::fromLatin1(QVar9);
                  in_stack_fffffffffffff830 = (QMakeEvaluator *)&stack0xffffffffffffffa0;
                  QStringView::QStringView<QString,_true>
                            ((QStringView *)
                             CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                             (QString *)in_stack_fffffffffffff7d8);
                  QVar8 = QStringView::mid(in_stack_fffffffffffff7e8,
                                           (qsizetype)in_stack_fffffffffffff7f8,
                                           (qsizetype)in_stack_fffffffffffff7f0);
                  local_6c8 = QVar8.m_size;
                  local_6c0 = QVar8.m_data;
                  local_180 = local_6c8;
                  local_178 = local_6c0;
                  QChar::QChar<char16_t,_true>(&local_182,L' ');
                  QString::arg<QStringView,_true>
                            ((QString *)in_stack_fffffffffffff7e8,
                             (QStringView *)
                             CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                             (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                             (QChar)(char16_t)((ulong)ctx >> 0x30));
                  evalError((QMakeEvaluator *)
                            CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                            (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8)
                           );
                  QString::~QString((QString *)0x2d1ef7);
                  QString::~QString((QString *)0x2d1f04);
                  local_6fc = ReturnFalse;
                  iVar15 = 1;
                  goto LAB_002d2003;
                }
                local_71c = 2;
              }
            }
          }
        }
      }
      QList<ProString>::const_iterator::operator++(&local_c0);
    }
    qVar4 = QList<ProString>::size(in_RSI);
    if (qVar4 < 3) {
      if (local_71c == 0) goto LAB_002d1ff8;
      QByteArrayView::QByteArrayView<59ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (char (*) [59])in_stack_fffffffffffff7d8);
      QVar10.m_data = local_1b0;
      QVar10.m_size = (qsizetype)local_1a0;
      QString::fromLatin1(QVar10);
      evalError((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      QString::~QString((QString *)0x2d1fde);
      local_6fc = ReturnFalse;
      iVar15 = 1;
      ctx = in_stack_fffffffffffff828;
    }
    else {
      QList<ProString>::at
                ((QList<ProString> *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      ProKey::operator=((ProKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                        (ProKey *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
LAB_002d1ff8:
      iVar15 = 0;
      ctx = in_stack_fffffffffffff828;
    }
LAB_002d2003:
    ProStringList::~ProStringList((ProStringList *)0x2d2010);
    if (iVar15 != 0) goto LAB_002d3015;
    in_stack_fffffffffffff8bc.i = 0;
  }
  local_1c8 = 0xaaaaaaaaaaaaaaaa;
  local_1c0 = 0xaaaaaaaaaaaaaaaa;
  local_1b8 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2d205d);
  memset(&local_1f8,0xaa,0x30);
  QList<ProString>::at
            ((QList<ProString> *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (ProKey *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  bVar1 = ProString::isEmpty(&local_1f8);
  if (bVar1) goto LAB_002d2970;
  bVar1 = ProString::isEmpty(&local_a0);
  if (bVar1) {
    ProKey::operator=((ProKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                      (ProKey *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  }
  local_200 = 0xaaaaaaaaaaaaaaaa;
  QMap<ProKey,_ProStringList>::iterator::iterator((iterator *)0x2d20fb);
  pPVar5 = findValues(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                      (Iterator *)in_stack_fffffffffffff7e8);
  if (pPVar5 != (ProValueMap *)0x0) {
    this_00 = &QMap<ProKey,_ProStringList>::iterator::operator*((iterator *)0x2d226c)->
               super_QList<ProString>;
    local_270 = 0xaaaaaaaaaaaaaaaa;
    local_268 = 0xaaaaaaaaaaaaaaaa;
    local_260 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x2d22ae);
    bVar14 = 0;
    bVar13 = 0;
    do {
      QMakeBaseKey::QMakeBaseKey
                ((QMakeBaseKey *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (QString *)in_stack_fffffffffffff7d8,
                 (QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 SUB41(in_stack_fffffffffffff7cc >> 0x18,0));
      pQVar6 = QHash<QMakeBaseKey,_QMakeBaseEnv_*>::value
                         ((QHash<QMakeBaseKey,_QMakeBaseEnv_*> *)in_stack_fffffffffffff7d8,
                          (QMakeBaseKey *)
                          CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
      QMakeBaseKey::~QMakeBaseKey
                ((QMakeBaseKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
      if (pQVar6 != (QMakeBaseEnv *)0x0) {
        values(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
        if (local_71c == 0) {
          ProStringList::operator=
                    ((ProStringList *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     (ProStringList *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
          ;
        }
        else {
          ProStringList::operator=
                    ((ProStringList *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     (ProStringList *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
          ;
          if (local_71c == 1) {
            QList<ProString>::operator+=
                      ((QList<ProString> *)
                       CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (QList<ProString> *)
                       CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          }
          else {
            ProStringList::removeEach
                      ((ProStringList *)
                       CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                       (ProStringList *)in_stack_fffffffffffff7d8);
          }
        }
        cVar2 = QList<ProString>::operator!=
                          ((QList<ProString> *)
                           CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QList<ProString> *)
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        if (cVar2) {
          if ((local_718 != 0) || (bVar1 = QString::isEmpty((QString *)0x2d243f), !bVar1)) {
            valuesRef(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
            ProStringList::operator=
                      ((ProStringList *)
                       CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (ProStringList *)
                       CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
            if (local_718 == 2) {
              QLatin1String::QLatin1String
                        ((QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                         (char *)in_stack_fffffffffffff7d8);
              other_05.m_data = (char *)in_stack_fffffffffffff818;
              other_05.m_size = (qsizetype)pQVar6;
              bVar1 = ProString::operator==
                                ((ProString *)
                                 CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                 other_05);
              if (bVar1) {
                ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff7f0);
                QList<QString>::operator=
                          ((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QList<QString> *)
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
                QList<QString>::~QList((QList<QString> *)0x2d24f1);
                updateMkspecPaths(in_stack_fffffffffffff858);
              }
              else {
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                           (char *)in_stack_fffffffffffff7d8);
                other_06.m_data = (char *)in_stack_fffffffffffff818;
                other_06.m_size = (qsizetype)pQVar6;
                bVar1 = ProString::operator==
                                  ((ProString *)
                                   CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                   other_06);
                if (!bVar1) goto LAB_002d25d7;
                ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff7f0);
                QList<QString>::operator=
                          ((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QList<QString> *)
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
                QList<QString>::~QList((QList<QString> *)0x2d2575);
              }
              updateFeaturePaths(in_stack_fffffffffffff888);
              if ((bVar13 & 1) == (*(byte *)(in_RDI + 0x91) & 1)) {
                QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
                          ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)
                           CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QExplicitlySharedDataPointer<QMakeFeatureRoots> *)
                           CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
              }
            }
          }
LAB_002d25d7:
          bVar14 = 1;
        }
        ProStringList::~ProStringList((ProStringList *)0x2d25ec);
      }
      if ((bVar13 & 1) != 0) goto LAB_002d2609;
      bVar13 = 1;
    } while( true );
  }
  QByteArrayView::QByteArrayView<28ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             (char (*) [28])in_stack_fffffffffffff7d8);
  fillChar.ucs = (char16_t)((ulong)ctx >> 0x30);
  QVar11.m_data = local_240;
  QVar11.m_size = (qsizetype)local_230;
  QString::fromLatin1(QVar11);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             (QString *)in_stack_fffffffffffff7d8);
  iVar15 = (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
  QVar8 = QStringView::mid(in_stack_fffffffffffff7e8,(qsizetype)in_stack_fffffffffffff7f8,
                           (qsizetype)in_stack_fffffffffffff7f0);
  local_6e0 = QVar8.m_size;
  local_6d8 = QVar8.m_data;
  local_250 = local_6e0;
  local_248 = local_6d8;
  QChar::QChar<char16_t,_true>(&local_252,L' ');
  QString::arg<QStringView,_true>
            ((QString *)in_stack_fffffffffffff7e8,
             (QStringView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),iVar15,
             fillChar);
  evalError((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
            (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  QString::~QString((QString *)0x2d2225);
  QString::~QString((QString *)0x2d2232);
  local_6fc = ReturnFalse;
  goto LAB_002d2ffb;
LAB_002d2609:
  if ((bVar3) && ((bVar14 & 1) != 0)) {
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
    ;
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    QString::~QString((QString *)0x2d266f);
    if (local_71c == 1) {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (char *)in_stack_fffffffffffff7d8);
      s.m_size._4_4_ = in_stack_fffffffffffff7e4;
      s.m_size._0_4_ = in_stack_fffffffffffff7e0;
      s.m_data = (char *)in_stack_fffffffffffff7e8;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),s
                         );
    }
    else if (local_71c == 2) {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (char *)in_stack_fffffffffffff7d8);
      s_00.m_size._4_4_ = in_stack_fffffffffffff7e4;
      s_00.m_size._0_4_ = in_stack_fffffffffffff7e0;
      s_00.m_data = (char *)in_stack_fffffffffffff7e8;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                          s_00);
    }
    else {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                 (char *)in_stack_fffffffffffff7d8);
      s_01.m_size._4_4_ = in_stack_fffffffffffff7e4;
      s_01.m_size._0_4_ = in_stack_fffffffffffff7e0;
      s_01.m_data = (char *)in_stack_fffffffffffff7e8;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                          s_01);
    }
    qVar4 = QList<ProString>::size(this_00);
    if (qVar4 == 1) {
      QLatin1Char::QLatin1Char(local_323,' ');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffff7d8 >> 0x38));
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                          (QChar)(char16_t)((ulong)in_stack_fffffffffffff7d8 >> 0x30));
      QList<ProString>::at
                ((QList<ProString> *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      quoteValue(in_stack_fffffffffffff800);
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                          (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      QString::~QString((QString *)0x2d27b2);
    }
    else {
      bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x2d27c4);
      if (!bVar3) {
        local_348[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_348[0] = QList<ProString>::begin
                                 ((QList<ProString> *)
                                  CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
        local_350.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_350 = QList<ProString>::end
                              ((QList<ProString> *)
                               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
        while( true ) {
          local_358 = local_350.i;
          bVar3 = QList<ProString>::const_iterator::operator!=(local_348,local_350);
          if (!bVar3) break;
          QList<ProString>::const_iterator::operator*(local_348);
          QLatin1String::QLatin1String
                    ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                     (char *)in_stack_fffffffffffff7d8);
          s_02.m_size._4_4_ = in_stack_fffffffffffff7e4;
          s_02.m_size._0_4_ = in_stack_fffffffffffff7e0;
          s_02.m_data = (char *)in_stack_fffffffffffff7e8;
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),s_02);
          quoteValue(in_stack_fffffffffffff800);
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          QString::~QString((QString *)0x2d28f3);
          QList<ProString>::const_iterator::operator++(local_348);
        }
      }
    }
    QLatin1Char::QLatin1Char(local_383,'\n');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffff7d8 >> 0x38));
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                        (QChar)(char16_t)((ulong)in_stack_fffffffffffff7d8 >> 0x30));
    iVar15 = 0;
  }
  else {
    local_6fc = ReturnTrue;
    iVar15 = 1;
  }
  ProStringList::~ProStringList((ProStringList *)0x2d295d);
  if (iVar15 == 0) {
    in_stack_fffffffffffff8bc.i = 0;
LAB_002d2970:
    local_3a0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_3a0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_3a0.d.size = -0x5555555555555556;
    QString::QString((QString *)0x2d29aa);
    local_3a4 = 0xaaaaaaaa;
    QFlags<QMakeVfs::VfsFlag>::QFlags
              ((QFlags<QMakeVfs::VfsFlag> *)
               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               in_stack_fffffffffffff7cc);
    if (local_718 == 2) {
      bVar3 = QString::isEmpty((QString *)0x2d29e8);
      if (bVar3) {
        this_01 = (QMakeEvaluator *)(in_RDI + 0x70);
        QLatin1String::QLatin1String
                  ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   (char *)in_stack_fffffffffffff7d8);
        ::operator+((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                    (QLatin1String *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_QLatin1String> *)
                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        QDir::cleanPath((QString *)local_3c0);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
        ;
        QString::~QString((QString *)0x2d2a83);
        QString::~QString((QString *)0x2d2a90);
        QDir::toNativeSeparators((QString *)local_430);
        QtPrivate::asString(local_430);
        QString::toLocal8Bit((QString *)in_stack_fffffffffffff7e8);
        pcVar7 = QByteArray::constData((QByteArray *)0x2d2ad6);
        printf("Info: creating super cache file %s\n",pcVar7);
        QByteArray::~QByteArray((QByteArray *)0x2d2af4);
        QString::~QString((QString *)0x2d2b01);
        ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        valuesRef(this_01,in_stack_fffffffffffff7f0);
        ProString::ProString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProStringList::operator<<
                  ((ProStringList *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProString::~ProString((ProString *)0x2d2b6a);
        ProKey::~ProKey((ProKey *)0x2d2b77);
      }
      QString::operator=(&local_3a0,(QString *)(in_RDI + 200));
      this_03 = (QByteArrayView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0);
    }
    else if (local_718 == 1) {
      bVar3 = QString::isEmpty((QString *)0x2d2bba);
      if (bVar3) {
        this_02 = (QString *)(in_RDI + 0x70);
        QLatin1String::QLatin1String
                  ((QLatin1String *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   (char *)in_stack_fffffffffffff7d8);
        ::operator+((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                    (QLatin1String *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_QLatin1String> *)
                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        QDir::cleanPath((QString *)local_4a8);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
        ;
        QString::~QString((QString *)0x2d2c55);
        QString::~QString((QString *)0x2d2c62);
        QDir::toNativeSeparators((QString *)local_518);
        QtPrivate::asString(local_518);
        QString::toLocal8Bit(this_02);
        pcVar7 = QByteArray::constData((QByteArray *)0x2d2ca8);
        printf("Info: creating cache file %s\n",pcVar7);
        QByteArray::~QByteArray((QByteArray *)0x2d2cc6);
        QString::~QString((QString *)0x2d2cd3);
        ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        valuesRef(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
        ProString::ProString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProStringList::operator<<
                  ((ProStringList *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProString::~ProString((ProString *)0x2d2d3c);
        ProKey::~ProKey((ProKey *)0x2d2d49);
      }
      QString::operator=(&local_3a0,(QString *)(in_RDI + 0xf8));
      this_03 = (QByteArrayView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0);
    }
    else {
      QString::operator=(&local_3a0,(QString *)(in_RDI + 0x110));
      bVar3 = QString::isEmpty((QString *)0x2d2d93);
      this_03 = (QByteArrayView *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0);
      if (bVar3) {
        this_03 = (QByteArrayView *)(in_RDI + 0x70);
        QLatin1String::QLatin1String((QLatin1String *)this_03,(char *)in_stack_fffffffffffff7d8);
        ::operator+((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                    (QLatin1String *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_QLatin1String> *)
                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        QDir::cleanPath((QString *)local_590);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                           (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8))
        ;
        QString::~QString((QString *)0x2d2e27);
        QString::~QString((QString *)0x2d2e34);
      }
      local_5d4 = local_3a4;
      bVar3 = QMakeVfs::exists(in_stack_fffffffffffff7d8,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                               (QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>)
                               SUB84((ulong)this_03 >> 0x20,0));
      if (!bVar3) {
        QDir::toNativeSeparators((QString *)local_608);
        QtPrivate::asString(local_608);
        QString::toLocal8Bit((QString *)in_stack_fffffffffffff7e8);
        pcVar7 = QByteArray::constData((QByteArray *)0x2d2eac);
        printf("Info: creating stash file %s\n",pcVar7);
        QByteArray::~QByteArray((QByteArray *)0x2d2eca);
        QString::~QString((QString *)0x2d2ed7);
        ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       (char *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        in_stack_fffffffffffff7d8 =
             (QMakeVfs *)valuesRef(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
        ProString::ProString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (QString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProStringList::operator<<
                  ((ProStringList *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (ProString *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        ProString::~ProString((ProString *)0x2d2f39);
        ProKey::~ProKey((ProKey *)0x2d2f46);
      }
    }
    QByteArrayView::QByteArrayView<7ul>(this_03,(char (*) [7])in_stack_fffffffffffff7d8);
    QVar12.m_data = local_690;
    QVar12.m_size = (qsizetype)local_680;
    QString::fromLatin1(QVar12);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               in_stack_fffffffffffff7cc);
    local_6fc = writeFile(in_stack_fffffffffffff830,(QString *)ctx,in_stack_fffffffffffff820,
                          (OpenMode)in_stack_fffffffffffff8bc.i,
                          (VfsFlags)in_stack_fffffffffffff8b8.i,in_stack_fffffffffffff818);
    QString::~QString((QString *)0x2d2fe3);
    QString::~QString((QString *)0x2d2ffb);
  }
LAB_002d2ffb:
  ProKey::~ProKey((ProKey *)0x2d3008);
  QString::~QString((QString *)0x2d3015);
LAB_002d3015:
  ProKey::~ProKey((ProKey *)0x2d3022);
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_6fc;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::testFunc_cache(const ProStringList &args)
{
    bool persist = true;
    enum { TargetStash, TargetCache, TargetSuper } target = TargetCache;
    enum { CacheSet, CacheAdd, CacheSub } mode = CacheSet;
    ProKey srcvar;
    if (args.size() >= 2) {
        const auto opts = split_value_list(args.at(1).toQStringView());
        for (const ProString &opt : opts) {
            if (opt == QLatin1String("transient")) {
                persist = false;
            } else if (opt == QLatin1String("super")) {
                target = TargetSuper;
            } else if (opt == QLatin1String("stash")) {
                target = TargetStash;
            } else if (opt == QLatin1String("set")) {
                mode = CacheSet;
            } else if (opt == QLatin1String("add")) {
                mode = CacheAdd;
            } else if (opt == QLatin1String("sub")) {
                mode = CacheSub;
            } else {
                evalError(fL1S("cache(): invalid flag %1.").arg(opt.toQStringView()));
                return ReturnFalse;
            }
        }
        if (args.size() >= 3) {
            srcvar = args.at(2).toKey();
        } else if (mode != CacheSet) {
            evalError(fL1S("cache(): modes other than 'set' require a source variable."));
            return ReturnFalse;
        }
    }
    QString varstr;
    ProKey dstvar = args.at(0).toKey();
    if (!dstvar.isEmpty()) {
        if (srcvar.isEmpty())
            srcvar = dstvar;
        ProValueMap::Iterator srcvarIt;
        if (!findValues(srcvar, &srcvarIt)) {
            evalError(fL1S("Variable %1 is not defined.").arg(srcvar.toQStringView()));
            return ReturnFalse;
        }
        // The caches for the host and target may differ (e.g., when we are manipulating
        // CONFIG), so we cannot compute a common new value for both.
        const ProStringList &diffval = *srcvarIt;
        ProStringList newval;
        bool changed = false;
        for (bool hostBuild = false; ; hostBuild = true) {
#ifdef PROEVALUATOR_THREAD_SAFE
            m_option->mutex.lock();
#endif
            QMakeBaseEnv *baseEnv =
                m_option->baseEnvs.value(QMakeBaseKey(m_buildRoot, m_stashfile, hostBuild));
#ifdef PROEVALUATOR_THREAD_SAFE
            // It's ok to unlock this before locking baseEnv,
            // as we have no intention to initialize the env.
            m_option->mutex.unlock();
#endif
            do {
                if (!baseEnv)
                    break;
#ifdef PROEVALUATOR_THREAD_SAFE
                QMutexLocker locker(&baseEnv->mutex);
                if (baseEnv->inProgress && baseEnv->evaluator != this) {
                    // The env is still in the works, but it may be already past the cache
                    // loading. So we need to wait for completion and amend it as usual.
                    QThreadPool::globalInstance()->releaseThread();
                    baseEnv->cond.wait(&baseEnv->mutex);
                    QThreadPool::globalInstance()->reserveThread();
                }
                if (!baseEnv->isOk)
                    break;
#endif
                QMakeEvaluator *baseEval = baseEnv->evaluator;
                const ProStringList &oldval = baseEval->values(dstvar);
                if (mode == CacheSet) {
                    newval = diffval;
                } else {
                    newval = oldval;
                    if (mode == CacheAdd)
                        newval += diffval;
                    else
                        newval.removeEach(diffval);
                }
                if (oldval != newval) {
                    if (target != TargetStash || !m_stashfile.isEmpty()) {
                        baseEval->valuesRef(dstvar) = newval;
                        if (target == TargetSuper) {
                            do {
                                if (dstvar == QLatin1String("QMAKEPATH")) {
                                    baseEval->m_qmakepath = newval.toQStringList();
                                    baseEval->updateMkspecPaths();
                                } else if (dstvar == QLatin1String("QMAKEFEATURES")) {
                                    baseEval->m_qmakefeatures = newval.toQStringList();
                                } else {
                                    break;
                                }
                                baseEval->updateFeaturePaths();
                                if (hostBuild == m_hostBuild)
                                    m_featureRoots = baseEval->m_featureRoots;
                            } while (false);
                        }
                    }
                    changed = true;
                }
            } while (false);
            if (hostBuild)
                break;
        }
        // We assume that whatever got the cached value to be what it is now will do so
        // the next time as well, so we just skip the persisting if nothing changed.
        if (!persist || !changed)
            return ReturnTrue;
        varstr = dstvar.toQString();
        if (mode == CacheAdd)
            varstr += QLatin1String(" +=");
        else if (mode == CacheSub)
            varstr += QLatin1String(" -=");
        else
            varstr += QLatin1String(" =");
        if (diffval.size() == 1) {
            varstr += QLatin1Char(' ');
            varstr += quoteValue(diffval.at(0));
        } else if (!diffval.isEmpty()) {
            for (const ProString &vval : diffval) {
                varstr += QLatin1String(" \\\n    ");
                varstr += quoteValue(vval);
            }
        }
        varstr += QLatin1Char('\n');
    }
    QString fn;
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    if (target == TargetSuper) {
        if (m_superfile.isEmpty()) {
            m_superfile = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.super"));
            printf("Info: creating super cache file %s\n", qPrintable(QDir::toNativeSeparators(m_superfile)));
            valuesRef(ProKey("_QMAKE_SUPER_CACHE_")) << ProString(m_superfile);
        }
        fn = m_superfile;
    } else if (target == TargetCache) {
        if (m_cachefile.isEmpty()) {
            m_cachefile = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.cache"));
            printf("Info: creating cache file %s\n", qPrintable(QDir::toNativeSeparators(m_cachefile)));
            valuesRef(ProKey("_QMAKE_CACHE_")) << ProString(m_cachefile);
            // We could update m_{source,build}Root and m_featureRoots here, or even
            // "re-home" our rootEnv, but this doesn't sound too useful - if somebody
            // wanted qmake to find something in the build directory, he could have
            // done so "from the outside".
            // The sub-projects will find the new cache all by themselves.
        }
        fn = m_cachefile;
    } else {
        fn = m_stashfile;
        if (fn.isEmpty())
            fn = QDir::cleanPath(m_outputDir + QLatin1String("/.qmake.stash"));
        if (!m_vfs->exists(fn, flags)) {
            printf("Info: creating stash file %s\n", qPrintable(QDir::toNativeSeparators(fn)));
            valuesRef(ProKey("_QMAKE_STASH_")) << ProString(fn);
        }
    }
    return writeFile(fL1S("cache "), fn, QIODevice::Append, flags, varstr);
}